

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

OptionStatus
getLocalOptionValues
          (HighsLogOptions *report_log_options,string *option,
          vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
          HighsInt *current_value,HighsInt *min_value,HighsInt *max_value,HighsInt *default_value)

{
  OptionRecord *pOVar1;
  pointer pcVar2;
  OptionStatus OVar3;
  HighsInt index;
  string local_50;
  
  OVar3 = getOptionIndex(report_log_options,option,option_records,&index);
  if (OVar3 == kOk) {
    pOVar1 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
             _M_impl.super__Vector_impl_data._M_start[index];
    if (pOVar1->type == kInt) {
      if (current_value != (HighsInt *)0x0) {
        *current_value = *(HighsInt *)pOVar1[1]._vptr_OptionRecord;
      }
      if (min_value != (HighsInt *)0x0) {
        *min_value = pOVar1[1].type;
      }
      if (max_value != (HighsInt *)0x0) {
        *max_value = *(HighsInt *)&pOVar1[1].name._M_dataplus._M_p;
      }
      OVar3 = kOk;
      if (default_value != (HighsInt *)0x0) {
        *default_value = *(HighsInt *)&pOVar1[1].field_0xc;
      }
    }
    else {
      pcVar2 = (option->_M_dataplus)._M_p;
      optionEntryTypeToString_abi_cxx11_(&local_50,pOVar1->type);
      highsLogUser(report_log_options,kError,
                   "getLocalOptionValue: Option \"%s\" requires value of type %s, not HighsInt\n",
                   pcVar2,local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      OVar3 = kIllegalValue;
    }
  }
  else {
    OVar3 = kUnknownOption;
  }
  return OVar3;
}

Assistant:

OptionStatus getLocalOptionValues(
    const HighsLogOptions& report_log_options, const std::string& option,
    const std::vector<OptionRecord*>& option_records, HighsInt* current_value,
    HighsInt* min_value, HighsInt* max_value, HighsInt* default_value) {
  HighsInt index;
  OptionStatus status =
      getOptionIndex(report_log_options, option, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type != HighsOptionType::kInt) {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "getLocalOptionValue: Option \"%s\" requires value of type "
                 "%s, not HighsInt\n",
                 option.c_str(), optionEntryTypeToString(type).c_str());
    return OptionStatus::kIllegalValue;
  }
  OptionRecordInt& option_record = ((OptionRecordInt*)option_records[index])[0];
  if (current_value) *current_value = *(option_record.value);
  if (min_value) *min_value = option_record.lower_bound;
  if (max_value) *max_value = option_record.upper_bound;
  if (default_value) *default_value = option_record.default_value;
  return OptionStatus::kOk;
}